

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modules.cpp
# Opt level: O2

double opengv::relative_pose::modules::fivept_nister::polyVal(MatrixXd *p,double x)

{
  double dVar1;
  undefined1 auVar2 [16];
  Index IVar3;
  long lVar4;
  undefined1 auVar5 [64];
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 extraout_var [56];
  
  IVar3 = (p->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
  dVar6 = 0.0;
  lVar4 = 0;
  while (IVar3 != 0) {
    IVar3 = IVar3 + -1;
    dVar1 = (p->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data
            [(lVar4 >> 0x20) *
             (p->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows]
    ;
    auVar5._0_8_ = pow(x,(double)(int)IVar3);
    auVar5._8_56_ = extraout_var;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = dVar6;
    lVar4 = lVar4 + 0x100000000;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = dVar1;
    auVar2 = vfmadd231sd_fma(auVar7,auVar5._0_16_,auVar2);
    dVar6 = auVar2._0_8_;
  }
  return dVar6;
}

Assistant:

double
opengv::relative_pose::modules::fivept_nister::polyVal(
    const Eigen::MatrixXd & p,
    double x)
{
  size_t degree = p.cols();
  double value = 0.0;
  for( size_t power = degree; power > 0; power--)
      value += p(0, (int)(degree-power))*pow(x,(int)(power-1));

  return value;
}